

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O3

ssize_t __thiscall
LASreadItemCompressed_WAVEPACKET13_v1::read
          (LASreadItemCompressed_WAVEPACKET13_v1 *this,int __fd,void *__buf,size_t __nbytes)

{
  U64 *pUVar1;
  U8 *pUVar2;
  undefined8 uVar3;
  U64 UVar4;
  U64 UVar5;
  U64 UVar6;
  U32 UVar7;
  I32 IVar8;
  I32 IVar9;
  I32 IVar10;
  I32 IVar11;
  I32 IVar12;
  undefined4 in_register_00000034;
  undefined1 *puVar13;
  U64 UVar14;
  
  puVar13 = (undefined1 *)CONCAT44(in_register_00000034,__fd);
  UVar7 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_packet_index);
  *puVar13 = (char)UVar7;
  pUVar1 = (U64 *)this->last_item;
  UVar14 = *pUVar1;
  UVar4 = pUVar1[1];
  IVar9 = *(I32 *)((long)pUVar1 + 0xc);
  UVar5 = pUVar1[2];
  IVar11 = *(I32 *)((long)pUVar1 + 0x14);
  UVar6 = pUVar1[3];
  UVar7 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_offset_diff[this->sym_last_offset_diff])
  ;
  this->sym_last_offset_diff = UVar7;
  if (UVar7 != 0) {
    if (UVar7 == 2) {
      IVar8 = IntegerCompressor::decompress(this->ic_offset_diff,this->last_diff_32,0);
      this->last_diff_32 = IVar8;
      UVar14 = UVar14 + (long)IVar8;
    }
    else if (UVar7 == 1) {
      UVar14 = UVar14 + (uint)UVar4;
    }
    else {
      UVar14 = ArithmeticDecoder::readInt64(this->dec);
    }
  }
  IVar8 = IntegerCompressor::decompress(this->ic_packet_size,(uint)UVar4,0);
  IVar9 = IntegerCompressor::decompress(this->ic_return_point,IVar9,0);
  IVar10 = IntegerCompressor::decompress(this->ic_xyz,(I32)UVar5,0);
  IVar11 = IntegerCompressor::decompress(this->ic_xyz,IVar11,1);
  IVar12 = IntegerCompressor::decompress(this->ic_xyz,(I32)UVar6,2);
  puVar13[1] = (char)UVar14;
  puVar13[2] = (char)(UVar14 >> 8);
  puVar13[3] = (char)(UVar14 >> 0x10);
  puVar13[4] = (char)(UVar14 >> 0x18);
  puVar13[5] = (char)(UVar14 >> 0x20);
  puVar13[6] = (char)(UVar14 >> 0x28);
  puVar13[7] = (char)(UVar14 >> 0x30);
  puVar13[8] = (char)(UVar14 >> 0x38);
  puVar13[9] = (char)IVar8;
  puVar13[10] = (char)((uint)IVar8 >> 8);
  puVar13[0xb] = (char)((uint)IVar8 >> 0x10);
  puVar13[0xc] = (char)((uint)IVar8 >> 0x18);
  puVar13[0xd] = (char)IVar9;
  puVar13[0xe] = (char)((uint)IVar9 >> 8);
  puVar13[0xf] = (char)((uint)IVar9 >> 0x10);
  puVar13[0x10] = (char)((uint)IVar9 >> 0x18);
  puVar13[0x11] = (char)IVar10;
  puVar13[0x12] = (char)((uint)IVar10 >> 8);
  puVar13[0x13] = (char)((uint)IVar10 >> 0x10);
  puVar13[0x14] = (char)((uint)IVar10 >> 0x18);
  puVar13[0x15] = (char)IVar11;
  puVar13[0x16] = (char)((uint)IVar11 >> 8);
  puVar13[0x17] = (char)((uint)IVar11 >> 0x10);
  puVar13[0x18] = (char)((uint)IVar11 >> 0x18);
  puVar13[0x19] = (char)IVar12;
  puVar13[0x1a] = (char)((uint)IVar12 >> 8);
  puVar13[0x1b] = (char)((uint)IVar12 >> 0x10);
  puVar13[0x1c] = (char)((uint)IVar12 >> 0x18);
  pUVar2 = this->last_item;
  uVar3 = *(undefined8 *)(puVar13 + 0x15);
  *(undefined8 *)(pUVar2 + 0xc) = *(undefined8 *)(puVar13 + 0xd);
  *(undefined8 *)(pUVar2 + 0x14) = uVar3;
  uVar3 = *(undefined8 *)(puVar13 + 9);
  *(undefined8 *)pUVar2 = *(undefined8 *)(puVar13 + 1);
  *(undefined8 *)(pUVar2 + 8) = uVar3;
  return (ssize_t)pUVar2;
}

Assistant:

inline void LASreadItemCompressed_WAVEPACKET13_v1::read(U8* item, U32& context)
{
  item[0] = (U8)(dec->decodeSymbol(m_packet_index));
  item++;

  LASwavepacket13 this_item_m;
  LASwavepacket13 last_item_m = LASwavepacket13::unpack(last_item);

  sym_last_offset_diff = dec->decodeSymbol(m_offset_diff[sym_last_offset_diff]);

  if (sym_last_offset_diff == 0)
  {
    this_item_m.offset = last_item_m.offset;
  }
  else if (sym_last_offset_diff == 1)
  {
    this_item_m.offset = last_item_m.offset + last_item_m.packet_size;
  }
  else if (sym_last_offset_diff == 2)
  {
    last_diff_32 = ic_offset_diff->decompress(last_diff_32);
    this_item_m.offset = last_item_m.offset + last_diff_32;
  }
  else
  {
    this_item_m.offset = dec->readInt64();
  }

  this_item_m.packet_size = ic_packet_size->decompress(last_item_m.packet_size);
  this_item_m.return_point.i32 = ic_return_point->decompress(last_item_m.return_point.i32);
  this_item_m.x.i32 = ic_xyz->decompress(last_item_m.x.i32, 0);
  this_item_m.y.i32 = ic_xyz->decompress(last_item_m.y.i32, 1);
  this_item_m.z.i32 = ic_xyz->decompress(last_item_m.z.i32, 2);

  this_item_m.pack(item);

  memcpy(last_item, item, 28);
}